

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O3

int X509_CRL_add0_revoked(X509_CRL *crl,X509_REVOKED *rev)

{
  X509_CRL_INFO *pXVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  
  pXVar1 = crl->crl;
  sk = (OPENSSL_STACK *)pXVar1->revoked;
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = OPENSSL_sk_new(X509_REVOKED_cmp);
    pXVar1->revoked = (stack_st_X509_REVOKED *)sk;
    if (sk == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar2 = OPENSSL_sk_push(sk,rev);
  if (sVar2 == 0) {
    return 0;
  }
  asn1_encoding_clear((ASN1_ENCODING *)&pXVar1->enc);
  return 1;
}

Assistant:

int X509_CRL_add0_revoked(X509_CRL *crl, X509_REVOKED *rev) {
  X509_CRL_INFO *inf;
  inf = crl->crl;
  if (!inf->revoked) {
    inf->revoked = sk_X509_REVOKED_new(X509_REVOKED_cmp);
  }
  if (!inf->revoked || !sk_X509_REVOKED_push(inf->revoked, rev)) {
    return 0;
  }
  asn1_encoding_clear(&inf->enc);
  return 1;
}